

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void google::protobuf::internal::OnShutdown(_func_void *func)

{
  MutexLock lock;
  MutexLock local_18;
  value_type local_10;
  
  InitShutdownFunctionsOnce();
  local_18.mu_ = shutdown_functions_mutex;
  Mutex::Lock(shutdown_functions_mutex);
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(shutdown_functions,&local_10);
  MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

void OnShutdown(void (*func)()) {
  InitShutdownFunctionsOnce();
  MutexLock lock(shutdown_functions_mutex);
  shutdown_functions->push_back(func);
}